

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx_compress.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  string local_68 [8];
  string compressed;
  string local_38 [8];
  string raw;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    std::__cxx11::string::string(local_38);
    bVar1 = mg::fs::read_file(argv[1],(string *)local_38);
    if (bVar1) {
      std::__cxx11::string::string(local_68);
      bVar1 = mg::data::mzx_compress((string *)local_38,(string *)local_68,true);
      if (bVar1) {
        bVar1 = mg::fs::write_file(argv[2],(string *)local_68);
        if (bVar1) {
          argv_local._4_4_ = 0;
        }
        else {
          argv_local._4_4_ = -1;
        }
      }
      else {
        fprintf(_stderr,"Compress failed\n");
        argv_local._4_4_ = -1;
      }
      std::__cxx11::string::~string(local_68);
    }
    else {
      argv_local._4_4_ = -1;
    }
    std::__cxx11::string::~string(local_38);
  }
  else {
    fprintf(_stderr,"%s infile outfile\n",*argv);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s infile outfile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string raw;
  if (!mg::fs::read_file(argv[1], raw)) {
    return -1;
  }

  // Decompress
  std::string compressed;
  if (!mg::data::mzx_compress(raw, compressed)) {
    fprintf(stderr, "Compress failed\n");
    return -1;
  }

  // Emit
  if (!mg::fs::write_file(argv[2], compressed)) {
    return -1;
  }

  return 0;
}